

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O0

String * axl::io::getCurrentDir(void)

{
  char *__ptr;
  String *in_RDI;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *unaff_retaddr;
  char *p;
  String *dir;
  String *p_00;
  
  p_00 = in_RDI;
  __ptr = get_current_dir_name();
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            (unaff_retaddr,(C *)p_00,(size_t)__ptr);
  free(__ptr);
  return in_RDI;
}

Assistant:

sl::String
getCurrentDir() {
#if (_AXL_OS_WIN)
	wchar_t dir[1024] = { 0 };
	::GetCurrentDirectoryW(countof(dir) - 1, dir);
	return dir;
#elif (_AXL_OS_POSIX)
	char* p = ::get_current_dir_name();
	sl::String dir = p;
	::free(p);
	return dir;
#endif
}